

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O3

void __thiscall
unodb::detail::
basic_inode_4<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
::basic_inode_4(basic_inode_4<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
                *this,db_type *param_1,key_view k1,art_key_type shifted_k2,tree_depth_type depth,
               leaf_type *child1,db_leaf_unique_ptr *child2)

{
  long lVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  ulong local_58;
  uint64_t u;
  basic_inode_4<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
  *local_48;
  EVP_PKEY_CTX *local_40;
  ulong local_38;
  
  local_38 = shifted_k2.field_0._8_8_;
  u = (uint64_t)k1._M_extent._M_extent_value;
  local_40 = (EVP_PKEY_CTX *)k1._M_ptr;
  sVar2 = u - depth.value;
  local_58 = 0;
  if (7 < sVar2) {
    sVar2 = 8;
  }
  local_48 = this;
  memcpy(&local_58,local_40 + depth.value,sVar2);
  uVar4 = local_58 & 0xffffffffffffff;
  local_58 = 0;
  sVar2 = 8;
  if (local_38 < 8) {
    sVar2 = local_38;
  }
  memcpy(&local_58,shifted_k2.field_0._0_8_,sVar2);
  uVar3 = local_58 ^ uVar4 | 0x100000000000000;
  lVar1 = 0;
  if (uVar3 != 0) {
    for (; (uVar3 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
    }
  }
  *(ulong *)local_48 = (ulong)((uint)lVar1 & 0xfffffff8) << 0x35 | uVar4;
  local_48->field_0x8 = 2;
  init(local_48,local_40);
  return;
}

Assistant:

constexpr basic_inode_4(db_type &, key_view k1, art_key_type shifted_k2,
                          tree_depth_type depth, leaf_type *child1,
                          db_leaf_unique_ptr &&child2) noexcept
      : parent_class{k1, shifted_k2, depth} {
    init(k1, shifted_k2, depth, child1, std::move(child2));
  }